

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

void __thiscall Activation::set(Activation *this,uint index,PARAM_NAME *param_name,double value)

{
  size_type sVar1;
  reference pvVar2;
  double value_local;
  PARAM_NAME *param_name_local;
  uint index_local;
  Activation *this_local;
  
  sVar1 = std::vector<Func_Param,_std::allocator<Func_Param>_>::size(&this->m_params);
  if (index < sVar1) {
    switch(*param_name) {
    case MID_POINT:
      pvVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::operator[]
                         (&this->m_params,(ulong)index);
      pvVar2->middle = value;
      break;
    case LENGTH:
      pvVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::operator[]
                         (&this->m_params,(ulong)index);
      pvVar2->length = value;
      break;
    case AMPLITUDE:
      pvVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::operator[]
                         (&this->m_params,(ulong)index);
      pvVar2->amplitude = value;
      break;
    case CONFIDENCE:
      pvVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::operator[]
                         (&this->m_params,(ulong)index);
      pvVar2->confidence = (uint)(long)value;
    }
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [activation set]: Index out of bounds!\n");
  exit(1);
}

Assistant:

void Activation::set(unsigned index, const PARAM_NAME& param_name, double value){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation set]: Index out of bounds!\n";
        exit(1);
    }
    
    switch (param_name)
    {
    case MID_POINT:
        m_params[index].middle=value;
        break;
    case LENGTH:
        m_params[index].length=value;
        break;
    case AMPLITUDE:
        m_params[index].amplitude=value;
        break;
    case CONFIDENCE:
        m_params[index].confidence=(unsigned)value;
        break;
    default: break;
    }
}